

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O0

void __thiscall CppJieba::TrieNodeInfo::TrieNodeInfo(TrieNodeInfo *this,TrieNodeInfo *nodeInfo)

{
  long in_RSI;
  long in_RDI;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_00000018;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_00000020;
  
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (in_stack_00000020,in_stack_00000018);
  *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)(in_RSI + 0x18);
  std::__cxx11::string::string((string *)(in_RDI + 0x20),(string *)(in_RSI + 0x20));
  *(undefined8 *)(in_RDI + 0x40) = *(undefined8 *)(in_RSI + 0x40);
  return;
}

Assistant:

TrieNodeInfo(const TrieNodeInfo& nodeInfo):word(nodeInfo.word), freq(nodeInfo.freq), tag(nodeInfo.tag), logFreq(nodeInfo.logFreq)
        {
        }